

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O2

void __thiscall webrtc::WavWriter::Close(WavWriter *this)

{
  int iVar1;
  string *result;
  uint local_1cc;
  uint8_t header [44];
  FatalMessage local_190;
  
  iVar1 = fseek((FILE *)this->file_handle_,0,0);
  result = rtc::CheckEQImpl_abi_cxx11_(0,iVar1,"0 == fseek(file_handle_, 0, 0)");
  if (result == (string *)0x0) {
    WriteWavHeader(header,this->num_channels_,this->sample_rate_,kWavFormatPcm,2,this->num_samples_)
    ;
    local_1cc = 1;
    local_190._0_8_ = fwrite(header,0x2c,1,(FILE *)this->file_handle_);
    result = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                       (&local_1cc,(unsigned_long *)&local_190,
                        "1u == fwrite(header, kWavHeaderSize, 1, file_handle_)");
    if (result == (string *)0x0) {
      iVar1 = fclose((FILE *)this->file_handle_);
      result = rtc::CheckEQImpl_abi_cxx11_(0,iVar1,"0 == fclose(file_handle_)");
      if (result == (string *)0x0) {
        this->file_handle_ = (FILE *)0x0;
        return;
      }
      iVar1 = 0xac;
    }
    else {
      iVar1 = 0xab;
    }
  }
  else {
    iVar1 = 0xa7;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,iVar1,result);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void WavWriter::Close() {
  RTC_CHECK_EQ(0, fseek(file_handle_, 0, SEEK_SET));
  uint8_t header[kWavHeaderSize];
  WriteWavHeader(header, num_channels_, sample_rate_, kWavFormat,
                 kBytesPerSample, num_samples_);
  RTC_CHECK_EQ(1u, fwrite(header, kWavHeaderSize, 1, file_handle_));
  RTC_CHECK_EQ(0, fclose(file_handle_));
  file_handle_ = NULL;
}